

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::SliderInt(char *label,int *v,int v_min,int v_max,char *display_format)

{
  bool bVar1;
  float local_2c;
  bool value_changed;
  char *pcStack_28;
  float v_f;
  char *display_format_local;
  int v_max_local;
  int v_min_local;
  int *v_local;
  char *label_local;
  
  pcStack_28 = display_format;
  if (display_format == (char *)0x0) {
    pcStack_28 = "%.0f";
  }
  local_2c = (float)*v;
  display_format_local._0_4_ = v_max;
  display_format_local._4_4_ = v_min;
  _v_max_local = v;
  v_local = (int *)label;
  bVar1 = SliderFloat(label,&local_2c,(float)v_min,(float)v_max,pcStack_28,1.0);
  *_v_max_local = (int)local_2c;
  return bVar1;
}

Assistant:

bool ImGui::SliderInt(const char* label, int* v, int v_min, int v_max, const char* display_format)
{
    if (!display_format)
        display_format = "%.0f";
    float v_f = (float)*v;
    bool value_changed = SliderFloat(label, &v_f, (float)v_min, (float)v_max, display_format, 1.0f);
    *v = (int)v_f;
    return value_changed;
}